

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::IfcRamp(IfcRamp *this)

{
  IfcRamp *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcRamp");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00f7d950);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>,
             &PTR_construction_vtable_24__00f7da88);
  *(undefined8 *)this = 0xf7d820;
  *(undefined8 *)&this->field_0x178 = 0xf7d938;
  *(undefined8 *)&this->field_0x88 = 0xf7d848;
  *(undefined8 *)&this->field_0x98 = 0xf7d870;
  *(undefined8 *)&this->field_0xd0 = 0xf7d898;
  *(undefined8 *)&this->field_0x100 = 0xf7d8c0;
  *(undefined8 *)&this->field_0x138 = 0xf7d8e8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf7d910;
  std::__cxx11::string::string
            ((string *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x10
            );
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}